

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

void __thiscall
ot::commissioner::TokenManager::SendTokenRequest(TokenManager *this,Handler<ByteArray> *aHandler)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  Error error;
  ByteArray tokenRequest;
  anon_class_40_2_1bbb15e4 onResponse;
  Request request;
  ErrorCode local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  ByteArray local_198;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  undefined1 local_150 [8];
  _Alloc_hider local_148;
  char local_138 [16];
  TokenManager *local_128;
  _Any_data local_120;
  code *local_110;
  string local_100;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  undefined1 local_b8 [64];
  pointer local_78;
  pointer local_70;
  _Alloc_hider local_60;
  char local_50 [32];
  
  local_1b8 = local_1a8;
  local_1b0 = 0;
  local_1a8[0] = 0;
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coap::Message::Message((Message *)local_b8,kConfirmable,kPost);
  local_128 = this;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)&local_120,aHandler);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"/.well-known/ccm","");
  coap::Message::SetUriPath((Error *)local_150,(Message *)local_b8,&local_100);
  uVar1 = local_150._0_4_;
  local_1c0 = local_150._0_4_;
  std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_148);
  if (local_148._M_p != local_138) {
    operator_delete(local_148._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (uVar1 == kNone) {
    coap::Message::SetContentFormat((Error *)local_150,(Message *)local_b8,kCWT);
    uVar1 = local_150._0_4_;
    local_1c0 = local_150._0_4_;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_148);
    if (local_148._M_p != local_138) {
      operator_delete(local_148._M_p);
    }
    if (uVar1 == kNone) {
      MakeTokenRequest((Error *)local_150,&local_198,&this->mPublicKey,&this->mCommissionerId,
                       &this->mDomainName);
      uVar1 = local_150._0_4_;
      local_1c0 = local_150._0_4_;
      std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_148);
      if (local_148._M_p != local_138) {
        operator_delete(local_148._M_p);
      }
      if (uVar1 == kNone) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,local_70,
                   local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        local_168 = (code *)0x0;
        pcStack_160 = (code *)0x0;
        local_178._M_unused._M_object = (void *)0x0;
        local_178._8_8_ = 0;
        puVar2 = (undefined8 *)operator_new(0x28);
        *puVar2 = local_128;
        std::
        function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
        ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
                    *)(puVar2 + 1),
                   (function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
                    *)&local_120);
        pcStack_160 = std::
                      _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager.cpp:189:23)>
                      ::_M_invoke;
        local_168 = std::
                    _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager.cpp:189:23)>
                    ::_M_manager;
        local_178._M_unused._M_object = puVar2;
        coap::CoapSecure::SendRequest
                  (&this->mRegistrarClient,(Request *)local_b8,(ResponseHandler *)&local_178);
        if (local_168 != (code *)0x0) {
          (*local_168)(&local_178,&local_178,__destroy_functor);
        }
      }
    }
  }
  if (local_1c0 != kNone) {
    local_e0._0_4_ = local_1c0;
    local_d8._M_p = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_1b8,local_1b8 + local_1b0);
    local_150 = (undefined1  [8])0x0;
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)
              ((_Any_data *)aHandler,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> **)local_150,(Error *)local_e0
              );
    if (local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p);
    }
  }
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,__destroy_functor);
  }
  if (local_60._M_p != local_50) {
    operator_delete(local_60._M_p);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree((_Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
               *)(local_b8 + 0x10));
  if (local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  return;
}

Assistant:

void TokenManager::SendTokenRequest(Commissioner::Handler<ByteArray> aHandler)
{
    Error     error;
    ByteArray tokenRequest;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [this, aHandler](const coap::Response *aResponse, Error aError) {
        Error               error;
        coap::ContentFormat contentFormat;

        SuccessOrExit(error = aError);
        VerifyOrDie(aResponse != nullptr);

        VerifyOrExit(aResponse->GetCode() == coap::Code::kChanged,
                     error = ERROR_BAD_FORMAT("expect response code as CoAP::CHANGED, but got {}",
                                              static_cast<int>(aResponse->GetCode())));
        VerifyOrExit(aResponse->GetContentFormat(contentFormat) == ErrorCode::kNone,
                     error = ERROR_BAD_FORMAT("cannot find valid CoAP Content Format option"));
        VerifyOrExit(
            contentFormat == coap::ContentFormat::kCoseSign1,
            error = ERROR_BAD_FORMAT("CoAP Content Format requires to be application/cose; cose-type=\"cose-sign1\""));

        SuccessOrExit(error = SetToken(aResponse->GetPayload()));

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
        else
        {
            aHandler(&mSignedToken, error);
        }

        // Disconnect from the registrar.
        mRegistrarClient.Disconnect(ERROR_NONE);
    };

    SuccessOrExit(error = request.SetUriPath(uri::kComToken));
    SuccessOrExit(error = request.SetContentFormat(coap::ContentFormat::kCWT));

    SuccessOrExit(error = MakeTokenRequest(tokenRequest, mPublicKey, mCommissionerId, mDomainName));
    request.Append(tokenRequest);
    mRegistrarClient.SendRequest(request, onResponse);

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}